

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O2

void __thiscall
CRenderTools::MapScreenToGroup
          (CRenderTools *this,float CenterX,float CenterY,CMapItemGroup *pGroup,float Zoom)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long in_FS_OFFSET;
  float aPoints [4];
  float local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->m_pGraphics->m_ScreenWidth;
  uVar2 = this->m_pGraphics->m_ScreenHeight;
  MapScreenToWorld(this,CenterX,CenterY,(float)(pGroup->super_CMapItemGroup_v1).m_ParallaxX / 100.0,
                   (float)(pGroup->super_CMapItemGroup_v1).m_ParallaxY / 100.0,
                   (float)(pGroup->super_CMapItemGroup_v1).m_OffsetX,
                   (float)(pGroup->super_CMapItemGroup_v1).m_OffsetY,
                   (float)(int)uVar1 / (float)(int)uVar2,Zoom,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[5])();
    return;
  }
  __stack_chk_fail(local_28,local_24,local_20,local_1c);
}

Assistant:

void CRenderTools::MapScreenToGroup(float CenterX, float CenterY, const CMapItemGroup *pGroup, float Zoom)
{
	float aPoints[4];
	MapScreenToWorld(CenterX, CenterY, pGroup->m_ParallaxX/100.0f, pGroup->m_ParallaxY/100.0f,
		pGroup->m_OffsetX, pGroup->m_OffsetY, Graphics()->ScreenAspect(), Zoom, aPoints);
	Graphics()->MapScreen(aPoints[0], aPoints[1], aPoints[2], aPoints[3]);
}